

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

size_t __thiscall
booster::aio::buffer_impl<const_char_*>::bytes_count(buffer_impl<const_char_*> *this)

{
  pointer peVar1;
  size_t sVar2;
  size_t *psVar3;
  long lVar4;
  
  sVar2 = (size_t)(uint)this->size_;
  if (sVar2 != 0) {
    if (this->size_ == 1) {
      return (this->entry_).size;
    }
    peVar1 = (this->vec_).
             super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->vec_).
                  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)peVar1;
    if (lVar4 == 0) {
      return 0;
    }
    lVar4 = lVar4 >> 4;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    psVar3 = &peVar1->size;
    sVar2 = 0;
    do {
      sVar2 = sVar2 + *psVar3;
      psVar3 = psVar3 + 2;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return sVar2;
}

Assistant:

size_t bytes_count() const
			{
				if(size_ == 0)
					return 0;
				if(size_ == 1)
					return entry_.size;
				size_t n = 0;
				for(size_t i=0;i<vec_.size();i++)
					n+=vec_[i].size;
				return n;
			}